

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Functional::StencilCase::iterate(StencilCase *this)

{
  uint uVar1;
  uint stencilBits;
  TestLog *log;
  int width;
  int iVar2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  uint uVar10;
  char *description;
  int ndx;
  int height;
  int iVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  int ndx_1;
  long lVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  float fVar21;
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ops;
  IVec4 viewport;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> cells;
  Surface refFrame;
  Surface gles2Frame;
  Random rnd;
  MultisamplePixelBufferAccess local_6328;
  MultisamplePixelBufferAccess local_6300;
  MultisamplePixelBufferAccess local_62d8;
  ReferenceContextBuffers buffers;
  ReferenceContextLimits local_6238;
  GLContext context;
  int *piVar9;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar9 = (int *)CONCAT44(extraout_var,iVar2);
  uVar1 = piVar9[6];
  stencilBits = piVar9[7];
  iVar2 = 1;
  if (stencilBits == 8) {
    iVar2 = 8;
  }
  uVar3 = 1 << ((byte)stencilBits & 0x1f);
  iVar4 = (int)uVar3 / iVar2;
  fVar21 = (float)(iVar4 + 3);
  if (fVar21 < 0.0) {
    fVar21 = sqrtf(fVar21);
  }
  else {
    fVar21 = SQRT(fVar21);
  }
  fVar21 = ceilf(fVar21);
  width = *piVar9;
  if (0x7f < *piVar9) {
    width = 0x80;
  }
  height = 0x80;
  if (piVar9[1] < 0x80) {
    height = piVar9[1];
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar5);
  iVar6 = de::Random::getInt((Random *)&rnd.m_rnd,0,*piVar9 - width);
  viewport.m_data[1] = de::Random::getInt((Random *)&rnd.m_rnd,0,piVar9[1] - height);
  viewport.m_data[0] = iVar6;
  viewport.m_data[2] = width;
  viewport.m_data[3] = height;
  tcu::Surface::Surface(&gles2Frame,width,height);
  tcu::Surface::Surface(&refFrame,width,height);
  std::
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ::vector(&ops,(long)(iVar4 + 3),(allocator_type *)&context);
  iVar6 = (int)fVar21;
  uVar10 = iVar4 + 1;
  lVar12 = 0;
  uVar16 = 0;
  if (0 < (int)uVar10) {
    uVar16 = (ulong)uVar10;
  }
  for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
    uVar15 = (int)uVar19 << (stencilBits == 8) * '\x03';
    if ((int)(uVar3 - 1) <= (int)uVar15) {
      uVar15 = uVar3 - 1;
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,(long)&((ops.
                             super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar12,(ulong)stencilBits,
               (ulong)uVar1,(ulong)uVar15);
    lVar12 = lVar12 + 0x18;
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,ops.
                  super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (int)uVar10,(ulong)stencilBits,
             (ulong)uVar1,(ulong)uVar3);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,ops.
                  super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (iVar4 + 2),(ulong)stencilBits,
             (ulong)uVar1,0xffffffffffffffff);
  cells.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cells.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cells.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = 0;
  iVar4 = 0;
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  for (; iVar7 != iVar4; iVar7 = iVar7 + 1) {
    iVar11 = 0;
    iVar18 = iVar6;
    while (bVar20 = iVar18 != 0, iVar18 = iVar18 + -1, bVar20) {
      context.super_Context._vptr_Context = (_func_int **)CONCAT44(iVar7 * (height / iVar6),iVar11);
      context.super_Context.m_type.super_ApiType.m_bits = (ApiType)(ApiType)(width / iVar6);
      context.super_Context._12_4_ = height / iVar6;
      std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
      emplace_back<tcu::Vector<int,4>>
                ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)&cells,
                 (Vector<int,_4> *)&context);
      iVar11 = iVar11 + width / iVar6;
    }
  }
  sglr::GLContext::GLContext
            (&context,((this->super_TestCase).m_context)->m_renderCtx,log,0,&viewport);
  dVar5 = sglr::GLContext::createProgram(&context,&(this->m_shader).super_ShaderProgram);
  this->m_shaderID = dVar5;
  sglr::GLContext::clearColor(&context,1.0,0.0,0.0,1.0);
  sglr::GLContext::clear(&context,0x4500);
  lVar17 = 0;
  lVar12 = 0;
  for (lVar13 = 0;
      lVar13 < (int)(((long)ops.
                            super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)ops.
                           super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18); lVar13 = lVar13 + 1)
  {
    executeOps(this,&context.super_Context,
               (IVec4 *)((long)(cells.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17),
               (vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                *)((long)&((ops.
                            super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + 0x18;
    lVar17 = lVar17 + 0x10;
  }
  visualizeStencil(this,&context.super_Context,stencilBits,iVar2);
  dVar5 = sglr::GLContext::getError(&context);
  sglr::Context::readPixels(&context.super_Context,&gles2Frame,0,0,width,height);
  sglr::GLContext::~GLContext(&context);
  context.super_Context._12_4_ = (uint)(piVar9[5] != 0) << 3;
  context.super_Context._vptr_Context = (_func_int **)0x800000008;
  context.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&buffers,(PixelFormat *)&context,piVar9[6],piVar9[7],width,height,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits
            (&local_6238,((this->super_TestCase).m_context)->m_renderCtx);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_62d8,&buffers);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_6300,&buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_6328,&buffers);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)&context,&local_6238,&local_62d8,&local_6300,&local_6328);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6238);
  dVar8 = sglr::ReferenceContext::createProgram
                    ((ReferenceContext *)&context,&(this->m_shader).super_ShaderProgram);
  this->m_shaderID = dVar8;
  sglr::ReferenceContext::clearColor((ReferenceContext *)&context,1.0,0.0,0.0,1.0);
  sglr::ReferenceContext::clear((ReferenceContext *)&context,0x4500);
  lVar17 = 0;
  lVar12 = 0;
  for (lVar13 = 0;
      lVar13 < (int)(((long)ops.
                            super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)ops.
                           super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18); lVar13 = lVar13 + 1)
  {
    executeOps(this,&context.super_Context,
               (IVec4 *)((long)(cells.
                                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17),
               (vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                *)((long)&((ops.
                            super__Vector_base<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + 0x18;
    lVar17 = lVar17 + 0x10;
  }
  visualizeStencil(this,&context.super_Context,stencilBits,iVar2);
  sglr::Context::readPixels(&context.super_Context,&refFrame,0,0,width,height);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)&context);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
  bVar20 = tcu::fuzzyCompare(log,"ComparisonResult","Image comparison result",&refFrame,&gles2Frame,
                             0.02,COMPARE_LOG_RESULT);
  pcVar14 = "Image comparison failed";
  if (bVar20) {
    pcVar14 = "Pass";
  }
  description = "Got unexpected error";
  if (dVar5 == 0) {
    description = pcVar14;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(dVar5 != 0 || !bVar20),description);
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&cells.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  std::
  vector<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>,_std::allocator<std::vector<deqp::gles2::Functional::StencilOp,_std::allocator<deqp::gles2::Functional::StencilOp>_>_>_>
  ::~vector(&ops);
  tcu::Surface::~Surface(&refFrame);
  tcu::Surface::~Surface(&gles2Frame);
  return STOP;
}

Assistant:

TestCase::IterateResult StencilCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	int							depthBits			= renderTarget.getDepthBits();
	int							stencilBits			= renderTarget.getStencilBits();

	int							stencilStep			= stencilBits == 8 ? 8 : 1;
	int							numStencilValues	= (1<<stencilBits)/stencilStep + 1;

	int							gridSize			= (int)deFloatCeil(deFloatSqrt((float)(numStencilValues+2)));

	int							width				= deMin32(128, renderTarget.getWidth());
	int							height				= deMin32(128, renderTarget.getHeight());

	tcu::TestLog&				log					= m_testCtx.getLog();
	de::Random					rnd					(deStringHash(m_name.c_str()));
	int							viewportX			= rnd.getInt(0, renderTarget.getWidth()-width);
	int							viewportY			= rnd.getInt(0, renderTarget.getHeight()-height);
	IVec4						viewport			= IVec4(viewportX, viewportY, width, height);

	tcu::Surface				gles2Frame			(width, height);
	tcu::Surface				refFrame			(width, height);
	GLenum						gles2Error;

	const char*					failReason			= DE_NULL;

	// Get ops for stencil values
	vector<vector<StencilOp> >	ops(numStencilValues+2);
	{
		// Values from 0 to max
		for (int ndx = 0; ndx < numStencilValues; ndx++)
			genOps(ops[ndx], stencilBits, depthBits, deMin32(ndx*stencilStep, (1<<stencilBits)-1));

		// -1 and max+1
		genOps(ops[numStencilValues+0], stencilBits, depthBits, 1<<stencilBits);
		genOps(ops[numStencilValues+1], stencilBits, depthBits, -1);
	}

	// Compute cells: (x, y, w, h)
	vector<IVec4>				cells;
	int							cellWidth			= width/gridSize;
	int							cellHeight			= height/gridSize;
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
		cells.push_back(IVec4(x*cellWidth, y*cellHeight, cellWidth, cellHeight));

	DE_ASSERT(ops.size() <= cells.size());

	// Execute for gles2 context
	{
		sglr::GLContext context(m_context.getRenderContext(), log, 0 /* don't log calls or program */, viewport);

		m_shaderID = context.createProgram(&m_shader);

		context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		for (int ndx = 0; ndx < (int)ops.size(); ndx++)
			executeOps(context, cells[ndx], ops[ndx]);

		visualizeStencil(context, stencilBits, stencilStep);

		gles2Error = context.getError();
		context.readPixels(gles2Frame, 0, 0, width, height);
	}

	// Execute for reference context
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(m_context.getRenderContext()), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		m_shaderID = context.createProgram(&m_shader);

		context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
		context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		for (int ndx = 0; ndx < (int)ops.size(); ndx++)
			executeOps(context, cells[ndx], ops[ndx]);

		visualizeStencil(context, stencilBits, stencilStep);

		context.readPixels(refFrame, 0, 0, width, height);
	}

	// Check error
	bool errorCodeOk = (gles2Error == GL_NO_ERROR);
	if (!errorCodeOk && !failReason)
		failReason = "Got unexpected error";

	// Compare images
	const float		threshold	= 0.02f;
	bool			imagesOk	= tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, gles2Frame, threshold, tcu::COMPARE_LOG_RESULT);

	if (!imagesOk && !failReason)
		failReason = "Image comparison failed";

	// Store test result
	bool isOk = errorCodeOk && imagesOk;
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: failReason);

	return STOP;
}